

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImBezierClosestPointCasteljau
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,float tess_tol)

{
  char *pcVar1;
  float p_closest_dist2;
  ImVec2 p_last;
  undefined1 local_3c [4];
  ImVec2 local_38;
  ImVec2 local_30;
  
  pcVar1 = (char *)p;
  if (tess_tol <= 0.0) {
    pcVar1 = "tess_tol > 0.0f";
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x485,"ImBezierClosestPointCasteljau","ImGui ASSERT FAILED: %s");
  }
  local_38 = *p1;
  local_30.x = 0.0;
  local_30.y = 0.0;
  local_3c = (undefined1  [4])0x7f7fffff;
  BezierClosestPointCasteljauStep
            (&local_30,&local_38,(ImVec2 *)local_3c,(float *)0x0,p->x,p->y,local_38.x,local_38.y,
             p2->x,p2->y,p3->x,p3->y,p4->x,(int)pcVar1);
  return local_30;
}

Assistant:

ImVec2 ImBezierClosestPointCasteljau(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, float tess_tol)
{
    IM_ASSERT(tess_tol > 0.0f);
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    BezierClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, tess_tol, 0);
    return p_closest;
}